

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_wrt.c
# Opt level: O1

_Bool tool_create_output_file(OutStruct *outs,OperationConfig *config)

{
  char *__file;
  GlobalConfig *config_00;
  bool bVar1;
  int __fd;
  FILE *pFVar2;
  size_t __n;
  int *piVar3;
  char *pcVar4;
  uint uVar5;
  
  __file = outs->filename;
  config_00 = config->global;
  if ((config->file_clobber_mode == CLOBBER_ALWAYS) ||
     ((config->file_clobber_mode == CLOBBER_DEFAULT && ((outs->field_0x8 & 2) == 0)))) {
    pFVar2 = fopen64(__file,"wb");
    goto LAB_0010c5ce;
  }
  do {
    __fd = open64(__file,0xc1,0x1b6);
    if (__fd != -1) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  if ((__fd == -1) && (config->file_clobber_mode == CLOBBER_NEVER)) {
    __n = strlen(__file);
    if (__n < 0xfffffffffffffff3) {
      pcVar4 = (char *)malloc(__n + 0xd);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "out of memory";
        goto LAB_0010c587;
      }
      memcpy(pcVar4,__file,__n);
      pcVar4[__n] = '.';
      piVar3 = __errno_location();
      uVar5 = 1;
      __fd = -1;
      while (((*piVar3 == 0x11 || (*piVar3 == 0x15)) && (uVar5 < 100))) {
        curl_msnprintf(pcVar4 + __n + 1,0xc,"%d",uVar5);
        uVar5 = uVar5 + 1;
        do {
          __fd = open64(pcVar4,0xc1,0x1b6);
          if (__fd != -1) goto LAB_0010c56e;
        } while (*piVar3 == 4);
      }
LAB_0010c56e:
      outs->filename = pcVar4;
      outs->field_0x8 = outs->field_0x8 | 1;
      bVar1 = true;
    }
    else {
      pcVar4 = "overflow in filename generation";
LAB_0010c587:
      bVar1 = false;
      errorf(config_00,pcVar4);
      __fd = -1;
    }
    if (bVar1) goto LAB_0010c59e;
    pFVar2 = (FILE *)0x0;
    bVar1 = false;
  }
  else {
LAB_0010c59e:
    bVar1 = true;
    if (__fd != -1) {
      pFVar2 = fdopen(__fd,"wb");
      if (pFVar2 != (FILE *)0x0) goto LAB_0010c5c9;
      close(__fd);
    }
    pFVar2 = (FILE *)0x0;
  }
LAB_0010c5c9:
  if (!bVar1) {
    return false;
  }
LAB_0010c5ce:
  if (pFVar2 == (FILE *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    warnf(config_00,"Failed to open the file %s: %s",__file,pcVar4);
  }
  else {
    outs->field_0x8 = outs->field_0x8 | 0xc;
    outs->stream = (FILE *)pFVar2;
    outs->bytes = 0;
    outs->init = 0;
  }
  return pFVar2 != (FILE *)0x0;
}

Assistant:

bool tool_create_output_file(struct OutStruct *outs,
                             struct OperationConfig *config)
{
  struct GlobalConfig *global;
  FILE *file = NULL;
  const char *fname = outs->filename;
  DEBUGASSERT(outs);
  DEBUGASSERT(config);
  global = config->global;
  DEBUGASSERT(fname && *fname);

  if(config->file_clobber_mode == CLOBBER_ALWAYS ||
     (config->file_clobber_mode == CLOBBER_DEFAULT &&
      !outs->is_cd_filename)) {
    /* open file for writing */
    file = fopen(fname, "wb");
  }
  else {
    int fd;
    do {
      fd = open(fname, O_CREAT | O_WRONLY | O_EXCL | CURL_O_BINARY, OPENMODE);
      /* Keep retrying in the hope that it is not interrupted sometime */
      /* !checksrc! disable ERRNOVAR 1 */
    } while(fd == -1 && errno == EINTR);
    if(config->file_clobber_mode == CLOBBER_NEVER && fd == -1) {
      int next_num = 1;
      size_t len = strlen(fname);
      size_t newlen = len + 13; /* nul + 1-11 digits + dot */
      char *newname;
      /* Guard against wraparound in new filename */
      if(newlen < len) {
        errorf(global, "overflow in filename generation");
        return FALSE;
      }
      newname = malloc(newlen);
      if(!newname) {
        errorf(global, "out of memory");
        return FALSE;
      }
      memcpy(newname, fname, len);
      newname[len] = '.';
      /* !checksrc! disable ERRNOVAR 1 */
      while(fd == -1 && /* have not successfully opened a file */
            (errno == EEXIST || errno == EISDIR) &&
            /* because we keep having files that already exist */
            next_num < 100 /* and we have not reached the retry limit */ ) {
        msnprintf(newname + len + 1, 12, "%d", next_num);
        next_num++;
        do {
          fd = open(newname, O_CREAT | O_WRONLY | O_EXCL | CURL_O_BINARY,
                             OPENMODE);
          /* Keep retrying in the hope that it is not interrupted sometime */
        } while(fd == -1 && errno == EINTR);
      }
      outs->filename = newname; /* remember the new one */
      outs->alloc_filename = TRUE;
    }
    /* An else statement to not overwrite existing files and not retry with
       new numbered names (which would cover
       config->file_clobber_mode == CLOBBER_DEFAULT && outs->is_cd_filename)
       is not needed because we would have failed earlier, in the while loop
       and `fd` would now be -1 */
    if(fd != -1) {
      file = fdopen(fd, "wb");
      if(!file)
        close(fd);
    }
  }

  if(!file) {
    warnf(global, "Failed to open the file %s: %s", fname,
          strerror(errno));
    return FALSE;
  }
  outs->s_isreg = TRUE;
  outs->fopened = TRUE;
  outs->stream = file;
  outs->bytes = 0;
  outs->init = 0;
  return TRUE;
}